

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,LoadFunc *load_func)

{
  LoadResult LVar1;
  long in_FS_OFFSET;
  DataStream prefix;
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fStack_68;
  DataStream local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_read_pos = 0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,char>(&local_48,key);
  std::
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&fStack_68,load_func);
  LVar1 = LoadRecords(pwallet,batch,key,&local_48,&fStack_68);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return LVar1;
  }
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, LoadFunc load_func)
{
    DataStream prefix;
    prefix << key;
    return LoadRecords(pwallet, batch, key, prefix, load_func);
}